

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

string * __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,TypedListenerFactory *this)

{
  getDescriptionImpl_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const override {
                return getDescriptionImpl( Detail::has_description<T>{} );
            }